

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

make_caster<std::vector<unsigned_long>_> * __thiscall
pybind11::detail::load_type<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (make_caster<std::vector<unsigned_long>_> *__return_storage_ptr__,detail *this,
          handle *handle)

{
  (__return_storage_ptr__->
  super_list_caster<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>).
  value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_list_caster<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>).
  value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_list_caster<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>).
  value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  load_type<std::vector<unsigned_long,std::allocator<unsigned_long>>,void>
            (__return_storage_ptr__,(handle *)this);
  return __return_storage_ptr__;
}

Assistant:

make_caster<T> load_type(const handle &handle) {
    make_caster<T> conv;
    load_type(conv, handle);
    return conv;
}